

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderDirectiveTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::tessellation_shader
               (NegativeTestContext *ctx)

{
  bool bVar1;
  ProgramSources *pPVar2;
  ExpectResult expect;
  string simpleVtxFrag;
  undefined1 local_290 [40];
  string tessEvaluation;
  string tessControl;
  undefined1 local_228 [40];
  undefined1 local_200 [40];
  undefined1 local_1d8 [40];
  ProgramSources sources;
  ProgramSources local_e0;
  
  bVar1 = NegativeTestContext::isShaderSupported(ctx,SHADERTYPE_TESSELLATION_CONTROL);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&simpleVtxFrag,"#version 310 es\nvoid main()\n{\n}\n",
               (allocator<char> *)&sources);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tessControl,
               "#version 310 es\nlayout(vertices = 3) out;\nvoid main()\n{\n}\n",
               (allocator<char> *)&sources);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tessEvaluation,
               "#version 310 es\nlayout(triangles, equal_spacing, cw) in;\nvoid main()\n{\n}\n",
               (allocator<char> *)&sources);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&sources,
               "GL_EXT_tessellation_shader features require enabling the extension in 310 es shaders."
               ,(allocator<char> *)local_290);
    NegativeTestContext::beginSection(ctx,(string *)&sources);
    std::__cxx11::string::~string((string *)&sources);
    memset(&sources,0,0xac);
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
    sources.transformFeedbackVaryings.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
    sources._193_8_ = 0;
    glu::VertexSource::VertexSource((VertexSource *)local_290,&simpleVtxFrag);
    pPVar2 = glu::ProgramSources::operator<<(&sources,(ShaderSource *)local_290);
    glu::TessellationControlSource::TessellationControlSource
              ((TessellationControlSource *)local_1d8,&tessControl);
    pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_1d8);
    glu::TessellationEvaluationSource::TessellationEvaluationSource
              ((TessellationEvaluationSource *)local_200,&tessEvaluation);
    pPVar2 = glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_200);
    glu::FragmentSource::FragmentSource((FragmentSource *)local_228,&simpleVtxFrag);
    glu::ProgramSources::operator<<(pPVar2,(ShaderSource *)local_228);
    std::__cxx11::string::~string((string *)(local_228 + 8));
    std::__cxx11::string::~string((string *)(local_200 + 8));
    std::__cxx11::string::~string((string *)(local_1d8 + 8));
    std::__cxx11::string::~string((string *)(local_290 + 8));
    glu::ProgramSources::ProgramSources(&local_e0,&sources);
    verifyProgram(ctx,&local_e0,expect);
    glu::ProgramSources::~ProgramSources(&local_e0);
    NegativeTestContext::endSection(ctx);
    glu::ProgramSources::~ProgramSources(&sources);
    std::__cxx11::string::~string((string *)&tessEvaluation);
    std::__cxx11::string::~string((string *)&tessControl);
    std::__cxx11::string::~string((string *)&simpleVtxFrag);
  }
  return;
}

Assistant:

void tessellation_shader (NegativeTestContext& ctx)
{
	if (ctx.isShaderSupported(glu::SHADERTYPE_TESSELLATION_CONTROL))
	{
		const std::string	simpleVtxFrag	=	"#version 310 es\n"
												"void main()\n"
												"{\n"
												"}\n";
		const std::string	tessControl		=	"#version 310 es\n"
												"layout(vertices = 3) out;\n"
												"void main()\n"
												"{\n"
												"}\n";
		const std::string	tessEvaluation	=	"#version 310 es\n"
												"layout(triangles, equal_spacing, cw) in;\n"
												"void main()\n"
												"{\n"
												"}\n";
		ctx.beginSection("GL_EXT_tessellation_shader features require enabling the extension in 310 es shaders.");
		glu::ProgramSources sources;
		sources << glu::VertexSource(simpleVtxFrag)
				<< glu::TessellationControlSource(tessControl)
				<< glu::TessellationEvaluationSource(tessEvaluation)
				<< glu::FragmentSource(simpleVtxFrag);
		verifyProgram(ctx, sources, EXPECT_RESULT_FAIL);
		ctx.endSection();
	}
}